

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pci.cpp
# Opt level: O2

void ixy::remove_driver(string *pci_addr)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_258;
  path path;
  ofstream s;
  byte abStack_1f0 [480];
  
  std::operator+(&bStack_258,"/sys/bus/pci/devices/",pci_addr);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,&bStack_258
                 ,"/driver/unbind");
  std::filesystem::__cxx11::path::path(&path,(string_type *)&s,auto_format);
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::~string((string *)&bStack_258);
  std::ofstream::ofstream(&s,path._M_pathname._M_dataplus._M_p,_S_out);
  if ((abStack_1f0[*(long *)(_s + -0x18)] & 5) == 0) {
    std::ostream::write((char *)&s,(long)(pci_addr->_M_dataplus)._M_p);
    if ((abStack_1f0[*(long *)(_s + -0x18)] & 5) != 0) {
      bStack_258._M_string_length = 0x10bdaf;
      error<ixy::Pair<ixy::None,char_const*>>
                ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/pci.cpp"
                 ,0x18,"remove_driver",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&bStack_258);
    }
    std::ofstream::close();
  }
  else {
    bStack_258._M_string_length = 0x10bd9e;
    debug<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/pci.cpp",
               0x13,"remove_driver",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&bStack_258);
  }
  std::ofstream::~ofstream(&s);
  std::filesystem::__cxx11::path::~path(&path);
  return;
}

Assistant:

void remove_driver(const std::string &pci_addr) {
    fs::path path{"/sys/bus/pci/devices/" + pci_addr + "/driver/unbind"};
    auto s = std::ofstream(path, std::ofstream::out);
    if (!s) {
        debug("no driver loaded");
        return;
    }
    s.write(pci_addr.c_str(), pci_addr.length());
    if (!s) {
        error("failed to unload driver for device");
    }
    s.close();
}